

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>
               (DecimalCastData<short> *state)

{
  bool bVar1;
  ExponentType EVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  ushort uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  EVar2 = state->exponent_type;
  if ((EVar2 != POSITIVE) &&
     (uVar3 = state->decimal_count - state->scale,
     state->scale <= state->decimal_count && uVar3 != '\0')) {
    state->excessive_decimals = uVar3;
  }
  if (state->excessive_decimals != '\0') {
    bVar1 = TruncateExcessiveDecimals<duckdb::DecimalCastData<short>,false>(state);
    if (!bVar1) {
      return false;
    }
    EVar2 = state->exponent_type;
  }
  if (((EVar2 == NONE) && (state->round_set == true)) && (state->should_round == true)) {
    state->result = state->result + 1;
  }
  uVar8 = state->result;
  if (state->decimal_count < state->scale) {
    bVar6 = state->scale + ~state->decimal_count;
    auVar14._8_8_ = 0x1000100010001;
    auVar14._0_8_ = (ulong)uVar8 | 0x1000100010000;
    auVar10._1_3_ = 0;
    auVar10[0] = bVar6;
    auVar10[4] = bVar6;
    auVar10._5_3_ = 0;
    auVar10[8] = bVar6;
    auVar10._9_3_ = 0;
    auVar10[0xc] = bVar6;
    auVar10._13_3_ = 0;
    iVar4 = 8;
    do {
      auVar9 = auVar14;
      auVar14._0_2_ = auVar9._0_2_ * L'\n';
      auVar14._2_2_ = auVar9._2_2_ * L'\n';
      auVar14._4_2_ = auVar9._4_2_ * L'\n';
      auVar14._6_2_ = auVar9._6_2_ * L'\n';
      auVar14._8_2_ = auVar9._8_2_ * L'\n';
      auVar14._10_2_ = auVar9._10_2_ * L'\n';
      auVar14._12_2_ = auVar9._12_2_ * L'\n';
      auVar14._14_2_ = auVar9._14_2_ * L'\n';
      iVar5 = iVar4 + -8;
      iVar7 = iVar4 + (bVar6 + 8 & 0xfffffff8);
      iVar4 = iVar5;
    } while (iVar7 != 0x10);
    iVar5 = -iVar5;
    auVar13._4_4_ = iVar5;
    auVar13._0_4_ = iVar5;
    auVar13._8_4_ = iVar5;
    auVar13._12_4_ = iVar5;
    auVar10 = auVar10 | _DAT_01d84390;
    auVar11 = (auVar13 | _DAT_01dabed0) ^ _DAT_01d84390;
    auVar12._0_4_ = -(uint)(auVar10._0_4_ < auVar11._0_4_);
    auVar12._4_4_ = -(uint)(auVar10._4_4_ < auVar11._4_4_);
    auVar12._8_4_ = -(uint)(auVar10._8_4_ < auVar11._8_4_);
    auVar12._12_4_ = -(uint)(auVar10._12_4_ < auVar11._12_4_);
    auVar13 = (ram0x01dabec0 | auVar13) ^ _DAT_01d84390;
    auVar11._0_4_ = -(uint)(auVar10._0_4_ < auVar13._0_4_);
    auVar11._4_4_ = -(uint)(auVar10._4_4_ < auVar13._4_4_);
    auVar11._8_4_ = -(uint)(auVar10._8_4_ < auVar13._8_4_);
    auVar11._12_4_ = -(uint)(auVar10._12_4_ < auVar13._12_4_);
    auVar10 = packssdw(auVar11,auVar12);
    auVar14 = ~auVar10 & auVar14 | auVar9 & auVar10;
    uVar8 = auVar14._14_2_ * auVar14._6_2_ * auVar14._10_2_ * auVar14._2_2_ *
            auVar14._12_2_ * auVar14._4_2_ * auVar14._8_2_ * auVar14._0_2_;
    state->result = uVar8;
  }
  return (short)uVar8 < state->limit;
}

Assistant:

static bool Finalize(T &state) {
		if (state.exponent_type != ExponentType::POSITIVE && state.decimal_count > state.scale) {
			//! Did not encounter an exponent, but ALLOW_EXPONENT was on
			state.excessive_decimals = state.decimal_count - state.scale;
		}
		if (state.excessive_decimals && !TruncateExcessiveDecimals<T, NEGATIVE>(state)) {
			return false;
		}
		if (state.exponent_type == ExponentType::NONE && state.round_set && state.should_round) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		//  if we have not gotten exactly "scale" decimals, we need to multiply the result
		//  e.g. if we have a string "1.0" that is cast to a DECIMAL(9,3), the value needs to be 1000
		//  but we have only gotten the value "10" so far, so we multiply by 1000
		for (uint8_t i = state.decimal_count; i < state.scale; i++) {
			state.result *= 10;
		}
		if (NEGATIVE) {
			return state.result > -state.limit;
		} else {
			return state.result < state.limit;
		}
	}